

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::InternalException::InternalException<unsigned_long,long,long>
          (InternalException *this,string *msg,unsigned_long params,long params_1,long params_2)

{
  long in_R9;
  string local_30;
  
  Exception::ConstructMessage<unsigned_long,long,long>
            (&local_30,(Exception *)msg,(string *)params,params_1,params_2,in_R9);
  InternalException(this,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}